

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_1::AssertionPrinter::printOriginalExpression(AssertionPrinter *this)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 *in_RDI;
  AssertionResult *in_stack_ffffffffffffffd8;
  
  bVar1 = AssertionResult::hasExpression((AssertionResult *)0x14198c);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)*in_RDI,' ');
    AssertionResult::getExpression_abi_cxx11_(in_stack_ffffffffffffffd8);
    std::operator<<(poVar2,(string *)&stack0xffffffffffffffd8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  }
  return;
}

Assistant:

void printOriginalExpression() const {
        if (result.hasExpression()) {
            stream << ' ' << result.getExpression();
        }
    }